

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsItem::setGraphicsEffect(QGraphicsItem *this,QGraphicsEffect *effect)

{
  QGraphicsItemPrivate *pQVar1;
  QGraphicsEffect *pQVar2;
  QGraphicsItem *pQVar3;
  QGraphicsItemEffectSourcePrivate *this_00;
  QGraphicsEffectSource *this_01;
  
  pQVar1 = (this->d_ptr).d;
  pQVar2 = pQVar1->graphicsEffect;
  if (pQVar2 != effect) {
    if (pQVar2 == (QGraphicsEffect *)0x0) {
      pQVar3 = pQVar1->parent;
      if (pQVar3 != (QGraphicsItem *)0x0) {
        QGraphicsItemPrivate::updateChildWithGraphicsEffectFlagRecursively((pQVar3->d_ptr).d);
      }
    }
    else {
      (**(code **)(*(long *)pQVar2 + 0x20))();
      ((this->d_ptr).d)->graphicsEffect = (QGraphicsEffect *)0x0;
    }
    if (effect != (QGraphicsEffect *)0x0) {
      this_00 = (QGraphicsItemEffectSourcePrivate *)operator_new(0xf0);
      QGraphicsItemEffectSourcePrivate::QGraphicsItemEffectSourcePrivate(this_00,this);
      this_01 = (QGraphicsEffectSource *)operator_new(0x10);
      QGraphicsEffectSource::QGraphicsEffectSource
                (this_01,(QGraphicsEffectSourcePrivate *)this_00,(QObject *)0x0);
      ((this->d_ptr).d)->graphicsEffect = effect;
      QGraphicsEffectPrivate::setGraphicsEffectSource
                (*(QGraphicsEffectPrivate **)&effect->field_0x8,(QGraphicsEffectSource *)this_01);
      prepareGeometryChange(this);
      return;
    }
  }
  return;
}

Assistant:

void QGraphicsItem::setGraphicsEffect(QGraphicsEffect *effect)
{
    if (d_ptr->graphicsEffect == effect)
        return;

    if (d_ptr->graphicsEffect) {
        delete d_ptr->graphicsEffect;
        d_ptr->graphicsEffect = nullptr;
    } else if (d_ptr->parent) {
        d_ptr->parent->d_ptr->updateChildWithGraphicsEffectFlagRecursively();
    }

    if (effect) {
        // Set new effect.
        QGraphicsEffectSourcePrivate *sourced = new QGraphicsItemEffectSourcePrivate(this);
        QGraphicsEffectSource *source = new QGraphicsEffectSource(*sourced);
        d_ptr->graphicsEffect = effect;
        effect->d_func()->setGraphicsEffectSource(source);
        prepareGeometryChange();
    }
}